

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_bn_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               blend_unit_fn blend)

{
  uint in_ECX;
  long in_RDX;
  longlong extraout_RDX;
  uint in_ESI;
  long lVar1;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar2 [16];
  __m128i alVar3;
  long in_stack_00000008;
  __m128i v_res_w;
  __m128i v_m1_w;
  __m128i v_m0_w;
  __m128i v_m0_b;
  int c;
  __m128i v_maxval_w;
  undefined8 local_d8;
  undefined4 local_ac;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  
  local_88 = in_R8;
  local_78 = in_RDX;
  local_68 = in_RDI;
  do {
    for (local_ac = 0; local_ac < (int)v_res_w[1]; local_ac = local_ac + 8) {
      alVar3 = xx_loadl_64((void *)(in_stack_00000008 + local_ac));
      auVar2._8_8_ = extraout_XMM0_Qb;
      auVar2._0_8_ = extraout_XMM0_Qa;
      auVar2 = pmovzxbw(auVar2,extraout_XMM0_Qa);
      local_d8 = auVar2._0_8_;
      local_48 = auVar2._0_2_;
      uStack_46 = auVar2._2_2_;
      uStack_44 = auVar2._4_2_;
      uStack_42 = auVar2._6_2_;
      lVar1 = local_88 + (long)local_ac * 2;
      (*(code *)v_m1_w[1])
                (local_d8,CONCAT26(0x40 - uStack_42,
                                   CONCAT24(0x40 - uStack_44,
                                            CONCAT22(0x40 - uStack_46,0x40 - local_48))),
                 local_78 + (long)local_ac * 2,lVar1,alVar3[1]);
      alVar3[1] = extraout_RDX;
      alVar3[0] = lVar1;
      xx_storeu_128((void *)(local_68 + (long)local_ac * 2),alVar3);
    }
    local_68 = local_68 + (ulong)in_ESI * 2;
    local_78 = local_78 + (ulong)in_ECX * 2;
    local_88 = local_88 + (ulong)in_R9D * 2;
    in_stack_00000008 = in_stack_00000008 + (ulong)(uint)v_res_w[0];
    v_m1_w[0]._0_4_ = (int)v_m1_w[0] + -1;
  } while ((int)v_m1_w[0] != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h,
    blend_unit_fn blend) {
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    for (c = 0; c < w; c += 8) {
      const __m128i v_m0_b = xx_loadl_64(mask + c);
      const __m128i v_m0_w = _mm_cvtepu8_epi16(v_m0_b);
      const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

      const __m128i v_res_w = blend(src0 + c, src1 + c, v_m0_w, v_m1_w);

      xx_storeu_128(dst + c, v_res_w);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}